

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::ElabSystemTaskSyntax::setChild
          (ElabSystemTaskSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0048ddb4 + *(int *)(&DAT_0048ddb4 + index * 4)))();
  return;
}

Assistant:

void ElabSystemTaskSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: name = child.token(); return;
        case 2: arguments = child.node() ? &child.node()->as<ArgumentListSyntax>() : nullptr; return;
        case 3: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}